

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O0

string * Al::build_string<char_const(&)[48]>(char (*args) [48])

{
  char *in_RSI;
  string *in_RDI;
  ostringstream oss;
  ostringstream local_188 [376];
  char *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::operator<<((ostream *)local_188,local_10);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string build_string(Args&&... args) {
  std::ostringstream oss;
  (oss << ... << args);
  return oss.str();
}